

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.cpp
# Opt level: O0

btVector3 __thiscall
btConvexInternalShape::localGetSupportingVertex(btConvexInternalShape *this,btVector3 *vec)

{
  btScalar *in_RSI;
  long *in_RDI;
  float fVar1;
  btScalar bVar2;
  undefined8 in_XMM1_Qa;
  btVector3 bVar3;
  btVector3 vecnorm;
  btVector3 supVertex;
  btVector3 *in_stack_ffffffffffffff98;
  btVector3 *this_00;
  btVector3 local_4c;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btVector3 local_30;
  btScalar *local_20;
  btVector3 local_10;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  
  local_20 = in_RSI;
  local_10.m_floats._0_8_ = (**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI);
  local_10.m_floats._8_8_ = in_XMM1_Qa;
  fVar1 = (float)(**(code **)(*in_RDI + 0x60))();
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_30.m_floats._0_8_ = *(undefined8 *)local_20;
    local_30.m_floats._8_8_ = *(undefined8 *)(local_20 + 2);
    bVar2 = btVector3::length2((btVector3 *)0x1b0a6f);
    if (bVar2 < 1.4210855e-14) {
      local_34 = -1.0;
      local_38 = -1.0;
      local_3c = -1.0;
      btVector3::setValue(&local_30,&local_34,&local_38,&local_3c);
    }
    this_00 = &local_30;
    btVector3::normalize(this_00);
    (**(code **)(*in_RDI + 0x60))();
    local_4c = ::operator*(this_00->m_floats,in_stack_ffffffffffffff98);
    btVector3::operator+=(&local_10,&local_4c);
  }
  bVar3.m_floats[0] = local_10.m_floats[0];
  auVar4._4_4_ = local_10.m_floats[1];
  register0x00001240 = local_10.m_floats[2];
  register0x00001244 = local_10.m_floats[3];
  return (btVector3)bVar3.m_floats;
}

Assistant:

btVector3	btConvexInternalShape::localGetSupportingVertex(const btVector3& vec)const
{
#ifndef __SPU__

	 btVector3	supVertex = localGetSupportingVertexWithoutMargin(vec);

	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;

#else
	btAssert(0);
	return btVector3(0,0,0);
#endif //__SPU__

 }